

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void NALUnit::writeUEGolombCode(BitStreamWriter *bitWriter,uint32_t value)

{
  undefined4 local_20;
  undefined4 local_1c;
  int nBit;
  int x;
  uint32_t maxVal;
  uint32_t value_local;
  BitStreamWriter *bitWriter_local;
  
  local_1c = 1;
  local_20 = 0;
  for (nBit = 0; (uint)nBit < value; nBit = local_1c + nBit) {
    local_1c = local_1c * 2;
    local_20 = local_20 + 1;
  }
  BitStreamWriter::putBits(bitWriter,local_20 + 1,1);
  BitStreamWriter::putBits(bitWriter,local_20,value - (local_1c + -1));
  return;
}

Assistant:

void NALUnit::writeUEGolombCode(BitStreamWriter& bitWriter, const uint32_t value)
{
    uint32_t maxVal = 0;
    int x = 1;
    int nBit = 0;
    for (; maxVal < value; maxVal += x)
    {
        x <<= 1;
        nBit++;
    }

    bitWriter.putBits(nBit + 1, 1);
    bitWriter.putBits(nBit, value - (x - 1));
}